

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  string f_file;
  int t;
  ostream *poVar1;
  Graph *this;
  invalid_argument *this_00;
  long lVar2;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  undefined1 auStack_218 [16];
  int treshhold;
  undefined4 uStack_204;
  _Head_base<0UL,_const_char_*,_false> local_200;
  string in_stack_fffffffffffffe08;
  string local_1d8 [32];
  _Tuple_impl<0UL,_const_char_*,_const_char_*> local_1b8;
  _Tuple_impl<0UL,_const_char_*,_const_char_*> local_1a8;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  file_names;
  _Tuple_impl<0UL,_const_char_*,_const_char_*> local_180;
  _Tuple_impl<0UL,_const_char_*,_const_char_*> local_170;
  int quality;
  _Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> local_120 [64];
  _Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> local_e0 [64];
  _Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> local_a0 [64];
  _Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> local_60 [64];
  
  treshhold = 0x105012;
  uStack_204 = 0;
  local_200._M_head_impl = "sample1.fasta";
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<char_const*,char_const*>
            ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)&quality,
             (_Tuple_impl<0UL,_const_char_*,_const_char_*> *)&treshhold);
  local_1a8.super__Tuple_impl<1UL,_const_char_*>.super__Head_base<1UL,_const_char_*,_false>.
  _M_head_impl = (_Head_base<1UL,_const_char_*,_false>)"qualities2.qual";
  local_1a8.super__Head_base<0UL,_const_char_*,_false>._M_head_impl = "sample2.fasta";
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<char_const*,char_const*>(local_120,&local_1a8);
  local_1b8.super__Tuple_impl<1UL,_const_char_*>.super__Head_base<1UL,_const_char_*,_false>.
  _M_head_impl = (_Head_base<1UL,_const_char_*,_false>)"qualities3.qual";
  local_1b8.super__Head_base<0UL,_const_char_*,_false>._M_head_impl = "sample3.fasta";
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<char_const*,char_const*>(local_e0,&local_1b8);
  local_170.super__Tuple_impl<1UL,_const_char_*>.super__Head_base<1UL,_const_char_*,_false>.
  _M_head_impl = (_Head_base<1UL,_const_char_*,_false>)"qualities4.qual";
  local_170.super__Head_base<0UL,_const_char_*,_false>._M_head_impl = "sample4.fasta";
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<char_const*,char_const*>(local_a0,&local_170);
  local_180.super__Tuple_impl<1UL,_const_char_*>.super__Head_base<1UL,_const_char_*,_false>.
  _M_head_impl = (_Head_base<1UL,_const_char_*,_false>)"qualities5.qual";
  local_180.super__Head_base<0UL,_const_char_*,_false>._M_head_impl = "sample5.fasta";
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<char_const*,char_const*>(local_60,&local_180);
  __l._M_len = 5;
  __l._M_array = (iterator)&quality;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&file_names,__l,(allocator_type *)(auStack_218 + 0xf));
  lVar2 = 0x100;
  do {
    std::
    _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)((long)&quality + lVar2));
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != -0x40);
  poVar1 = std::operator<<((ostream *)&std::cout,"What treshold [4, 7]?: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::istream::operator>>((istream *)&std::cin,&treshhold);
  if (*(int *)(_ITM_registerTMCloneTable + *(long *)(std::cin + -0x18)) == 0) {
    if (treshhold - 8U < 0xfffffffc) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Wrong number!");
    }
    else {
      poVar1 = std::operator<<((ostream *)&std::cout,"What quality [1, 40]?: ");
      std::endl<char,std::char_traits<char>>(poVar1);
      std::istream::operator>>((istream *)&std::cin,&quality);
      if (*(int *)(_ITM_registerTMCloneTable + *(long *)(std::cin + -0x18)) == 0) {
        if (0xffffffd7 < quality - 0x29U) {
          this = (Graph *)operator_new(0x50);
          t = treshhold;
          std::__cxx11::string::string(local_1d8,"sample1.fasta",(allocator *)&local_1a8);
          std::__cxx11::string::string
                    ((string *)&stack0xfffffffffffffe08,"qualities1.qual",(allocator *)&local_1b8);
          f_file.field_2._M_allocated_capacity._0_4_ = treshhold;
          f_file._M_dataplus._M_p = (pointer)auStack_218._0_8_;
          f_file._M_string_length = auStack_218._8_8_;
          f_file.field_2._M_allocated_capacity._4_4_ = uStack_204;
          f_file.field_2._8_8_ = local_200._M_head_impl;
          Graph::Graph(this,t,quality,f_file,in_stack_fffffffffffffe08);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffe08);
          std::__cxx11::string::~string(local_1d8);
          Graph::alignSequences(this);
          Graph::~Graph(this);
          operator_delete(this,0x50);
          std::
          vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&file_names);
          return 0;
        }
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_00,"Wrong number!");
      }
      else {
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_00,"Wrong number!");
      }
    }
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Wrong number!");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int main(){
    // every file
    const vector<tuple<string, string> > file_names = {
            make_tuple("sample1.fasta", "qualities1.qual"),
            make_tuple("sample2.fasta", "qualities2.qual"),
            make_tuple("sample3.fasta", "qualities3.qual"),
            make_tuple("sample4.fasta", "qualities4.qual"),
            make_tuple("sample5.fasta", "qualities5.qual")
    };
    int quality, treshhold;
    try{
        cout << "What treshold [4, 7]?: " << endl;
        cin >> treshhold;
        if(not(cin.good())){
            throw invalid_argument("Wrong number!");
        }
        if(treshhold < 4 or treshhold > 7)
            throw invalid_argument("Wrong number!");
        cout << "What quality [1, 40]?: " << endl;\
        cin >> quality;
        if(not(cin.good())){
            throw invalid_argument("Wrong number!");
        }
        if(quality < 1 or quality > 40)
            throw invalid_argument("Wrong number!");
    } catch(exception &e){
        cerr << e.what() << endl;
        exit(EXIT_FAILURE);
    }
    auto *G = new Graph(treshhold, quality, "sample1.fasta", "qualities1.qual");
    G->alignSequences();
    delete G;

    return 0;
}